

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O2

void * subcanvas_new(t_symbol *s)

{
  _binbuf *x;
  t_gobj *x_00;
  int iVar1;
  _glist *x_01;
  _glist *gl;
  t_atom *argv;
  t_symbol *ptVar2;
  t_symbol *ptVar3;
  t_object *ptVar4;
  word wVar5;
  t_symbol *in_RSI;
  char *pcVar6;
  t_gobj **pptVar7;
  t_float tVar8;
  t_atom a [6];
  
  pcVar6 = (char *)s;
  x_01 = canvas_getcurrent();
  if (*s->s_name == '\0') {
    pcVar6 = "/SUBPATCH/";
    s = gensym("/SUBPATCH/");
  }
  a[0].a_type = A_FLOAT;
  a[0].a_w.w_float = 0.0;
  a[1].a_w.w_index = 0x42480000;
  a[2].a_w.w_index = 0x43e10000;
  a[3].a_w.w_index = 0x43960000;
  a[4].a_type = A_SYMBOL;
  a[5].a_w.w_index = 0x3f800000;
  a[1].a_type = a[0].a_type;
  a[2].a_type = a[0].a_type;
  a[3].a_type = a[0].a_type;
  a[4].a_w.w_symbol = s;
  a[5].a_type = a[0].a_type;
  gl = canvas_new(pcVar6,in_RSI,6,a);
  if (((x_01 != (_glist *)0x0) && (x_01->gl_editor != (t_editor *)0x0)) &&
     (x = x_01->gl_editor->e_connectbuf, x != (_binbuf *)0x0)) {
    argv = binbuf_getvec(x);
    iVar1 = binbuf_getnatom(x_01->gl_editor->e_connectbuf);
    if (iVar1 == 7) {
      ptVar2 = atom_getsymbolarg(0,7,argv);
      ptVar3 = gensym("#X");
      if (ptVar2 == ptVar3) {
        ptVar2 = atom_getsymbolarg(1,7,argv);
        ptVar3 = gensym("connect");
        if (ptVar2 == ptVar3) {
          iVar1 = canvas_getindex(x_01,(t_gobj *)gl);
          tVar8 = atom_getfloat(argv + 5);
          if ((int)tVar8 == 0) {
            tVar8 = atom_getfloat(argv + 4);
            if (iVar1 == (int)tVar8) {
              tVar8 = atom_getfloat(argv + 2);
              iVar1 = (int)tVar8;
              tVar8 = atom_getfloat(argv + 3);
              pptVar7 = &x_01->gl_list;
              while ((x_00 = *pptVar7, 0 < iVar1 && (x_00 != (t_gobj *)0x0))) {
                iVar1 = iVar1 + -1;
                pptVar7 = &x_00->g_next;
              }
              if (x_00 != (t_gobj *)0x0) {
                ptVar4 = pd_checkobject(&x_00->g_pd);
                if (ptVar4 != (t_object *)0x0) {
                  ptVar4 = pd_checkobject(&x_00->g_pd);
                  iVar1 = obj_issignaloutlet(ptVar4,(int)tVar8);
                  pcVar6 = "inlet~";
                  if (iVar1 == 0) {
                    pcVar6 = "inlet";
                  }
                  wVar5.w_symbol = gensym(pcVar6);
                  if (wVar5.w_symbol != (t_symbol *)0x0) {
                    a[0].a_w.w_index = 0x42140000;
                    a[1].a_w.w_index = 0x42140000;
                    a[2].a_type = A_SYMBOL;
                    a[0].a_type = A_FLOAT;
                    a[1].a_type = A_FLOAT;
                    a[2].a_w.w_symbol = wVar5.w_symbol;
                    ptVar2 = gensym("obj");
                    canvas_obj(gl,ptVar2,3,a);
                    canvas_create_editor(gl);
                    glist_noselect(gl);
                    glist_select(gl,gl->gl_list);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  gl->gl_owner = x_01;
  canvas_pop(gl,1.0);
  return gl;
}

Assistant:

static void *subcanvas_new(t_symbol *s)
{
    t_atom a[6];
    t_canvas *x, *z = canvas_getcurrent();

    if (!*s->s_name) s = gensym("/SUBPATCH/");
    SETFLOAT(a+0, GLIST_DEFCANVASXLOC);
    SETFLOAT(a+1, GLIST_DEFCANVASYLOC);
    SETFLOAT(a+2, GLIST_DEFCANVASWIDTH);
    SETFLOAT(a+3, GLIST_DEFCANVASHEIGHT);
    SETSYMBOL(a+4, s);
    SETFLOAT(a+5, 1);
    x = canvas_new(0, 0, 6, a);

        /* check if subpatch is supposed to be connected (on the 1st inlet) */
    if(z && z->gl_editor && z->gl_editor->e_connectbuf)
    {
        t_atom*argv = binbuf_getvec(z->gl_editor->e_connectbuf);
        int argc = binbuf_getnatom(z->gl_editor->e_connectbuf);
        t_symbol *sob = 0;
        if ((argc == 7)
            && atom_getsymbolarg(0, argc, argv) == gensym("#X")
            && atom_getsymbolarg(1, argc, argv) == gensym("connect"))
        {
            int index2 = canvas_getindex(z, &x->gl_gobj);
            if (((int)atom_getfloat(argv+5) == 0)
                && (int)atom_getfloat(argv+4) == index2)
                {
                    int index1 = (int)atom_getfloat(argv+2);
                    int outno = (int)atom_getfloat(argv+3);
                    t_gobj*outobj=z->gl_list;
                        /* get handle to object */
                    while(index1-->0 && outobj)
                        outobj=outobj->g_next;
                    if(outobj && pd_checkobject(&outobj->g_pd))
                    {
                        if (obj_issignaloutlet(pd_checkobject(&outobj->g_pd), outno))
                            sob = gensym("inlet~");
                        else
                            sob = gensym("inlet");
                    }
                }
        }
        if(sob)
        {
                /* JMZ: weirdo hardcoded numbers, taken from
                 * glist_getnextxy(): 40
                 * and canvas_howputnew(): -3
                 */
            SETFLOAT(a+0, 37);
            SETFLOAT(a+1, 37);
            SETSYMBOL(a+2, sob);
            canvas_obj(x, gensym("obj"), 3, a);

                /* select the newly created inlet to continue autopatching */
            canvas_create_editor(x);
            glist_noselect(x);
            glist_select(x, x->gl_list);
        }
    }
    x->gl_owner = z;
    canvas_pop(x, 1);
    return (x);
}